

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcUtils.c
# Opt level: O1

Mvc_Cover_t *
Mvc_CoverUnivQuantify(Mvc_Cover_t *p,int iValueA0,int iValueA1,int iValueB0,int iValueB1)

{
  int *piVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  byte bVar5;
  byte bVar6;
  int iVar7;
  int iVar8;
  Mvc_Cover_t *pCover;
  Mvc_Cube_t *pMVar9;
  Mvc_CubeWord_t MVar10;
  Mvc_Cube_t *pMVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  Mvc_Cube_t *pCube;
  Mvc_List_t *pList;
  
  pCover = Mvc_CoverClone(p);
  pCube = (p->lCubes).pHead;
  if (pCube != (Mvc_Cube_t *)0x0) {
    iVar7 = iValueA0 >> 5;
    uVar15 = 1 << ((byte)iValueA0 & 0x1f);
    iVar8 = iValueA1 >> 5;
    uVar17 = 1 << ((byte)iValueA1 & 0x1f);
    uVar12 = 1 << ((byte)iValueB0 & 0x1f);
    uVar16 = 1 << ((byte)iValueB1 & 0x1f);
    bVar5 = (byte)iValueA0 & 0x1f;
    bVar6 = (byte)iValueA1 & 0x1f;
    do {
      uVar14 = pCube->pData[iVar7];
      uVar2 = pCube->pData[iVar8];
      if ((uVar2 & uVar17) == 0 && (uVar14 & uVar15) == 0) {
        __assert_fail("ValueA0 || ValueA1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/mvc/mvcUtils.c"
                      ,0x271,"Mvc_Cover_t *Mvc_CoverUnivQuantify(Mvc_Cover_t *, int, int, int, int)"
                     );
      }
      uVar3 = pCube->pData[iValueB0 >> 5];
      uVar4 = pCube->pData[iValueB1 >> 5];
      if ((uVar3 & uVar12) == 0 && (uVar4 & uVar16) == 0) {
        __assert_fail("ValueB0 || ValueB1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/mvc/mvcUtils.c"
                      ,0x272,"Mvc_Cover_t *Mvc_CoverUnivQuantify(Mvc_Cover_t *, int, int, int, int)"
                     );
      }
      if ((((uVar14 & uVar15) != 0) == ((uVar3 & uVar12) != 0)) ||
         (((uVar2 & uVar17) != 0) == ((uVar4 & uVar16) != 0))) {
        pMVar9 = Mvc_CubeDup(pCover,pCube);
        pMVar11 = (Mvc_Cube_t *)&pCover->lCubes;
        if ((pCover->lCubes).pHead != (Mvc_Cube_t *)0x0) {
          pMVar11 = (pCover->lCubes).pTail;
        }
        pMVar11->pNext = pMVar9;
        (pCover->lCubes).pTail = pMVar9;
        pMVar9->pNext = (Mvc_Cube_t *)0x0;
        piVar1 = &(pCover->lCubes).nItems;
        *piVar1 = *piVar1 + 1;
        uVar13 = pMVar9->pData[iVar7] & (-2 << bVar5 | 0xfffffffeU >> 0x20 - bVar5);
        MVar10 = pMVar9->pData[iVar7] | uVar15;
        if ((uVar3 & uVar12) == 0) {
          MVar10 = uVar13;
        }
        if ((uVar14 & uVar15) == 0) {
          MVar10 = uVar13;
        }
        pMVar9->pData[iVar7] = MVar10;
        uVar14 = pMVar9->pData[iVar8] & (-2 << bVar6 | 0xfffffffeU >> 0x20 - bVar6);
        MVar10 = pMVar9->pData[iVar8] | uVar17;
        if ((uVar4 & uVar16) == 0) {
          MVar10 = uVar14;
        }
        if ((uVar2 & uVar17) == 0) {
          MVar10 = uVar14;
        }
        pMVar9->pData[iVar8] = MVar10;
        pMVar9->pData[iValueB0 >> 5] = pMVar9->pData[iValueB0 >> 5] | uVar12;
        pMVar9->pData[iValueB1 >> 5] = pMVar9->pData[iValueB1 >> 5] | uVar16;
      }
      pCube = pCube->pNext;
    } while (pCube != (Mvc_Cube_t *)0x0);
  }
  return pCover;
}

Assistant:

Mvc_Cover_t * Mvc_CoverUnivQuantify( Mvc_Cover_t * p, 
    int iValueA0, int iValueA1, int iValueB0, int iValueB1 )
{
    Mvc_Cover_t * pCover;
    Mvc_Cube_t * pCube, * pCubeCopy;
    int ValueA0, ValueA1, ValueB0, ValueB1;

    // clone the cover
    pCover = Mvc_CoverClone( p );
    // copy the cube list
    Mvc_CoverForEachCube( p, pCube )
    {
        // get the bits
        ValueA0 = Mvc_CubeBitValue( pCube, iValueA0 );
        ValueA1 = Mvc_CubeBitValue( pCube, iValueA1 );
        ValueB0 = Mvc_CubeBitValue( pCube, iValueB0 );
        ValueB1 = Mvc_CubeBitValue( pCube, iValueB1 );

        // cannot be both zero because they belong to the same var
        assert( ValueA0 || ValueA1 ); 
        assert( ValueB0 || ValueB1 ); 

        // if the values of this var are different, do not add the cube
        if ( ValueA0 != ValueB0 && ValueA1 != ValueB1 )
            continue;

        // create the cube
        pCubeCopy = Mvc_CubeDup( pCover, pCube );
        Mvc_CoverAddCubeTail( pCover, pCubeCopy );

        // insert 1's into for the first var, if both have this value
        if ( ValueA0 && ValueB0 )
            Mvc_CubeBitInsert( pCubeCopy, iValueA0 );
        else
            Mvc_CubeBitRemove( pCubeCopy, iValueA0 );

        if ( ValueA1 && ValueB1 )
            Mvc_CubeBitInsert( pCubeCopy, iValueA1 );
        else
            Mvc_CubeBitRemove( pCubeCopy, iValueA1 );
            
        // insert 1's into for the second var (the cover does not depend on it)
        Mvc_CubeBitInsert( pCubeCopy, iValueB0 );
        Mvc_CubeBitInsert( pCubeCopy, iValueB1 );
    }
    return pCover;
}